

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuGetUpdateStmt(sqlite3rbu *p,RbuObjIter *pIter,char *zMask,sqlite3_stmt **ppStmt)

{
  int iVar1;
  char *p_00;
  char *p_01;
  undefined8 in_R9;
  char *pcVar2;
  char *zPrefix;
  char *zUpdate;
  char *zSet;
  char *zWhere;
  RbuUpdateStmt *pRStack_40;
  int nUp;
  RbuUpdateStmt *pUp;
  RbuUpdateStmt **pp;
  sqlite3_stmt **ppStmt_local;
  char *zMask_local;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  pRStack_40 = (RbuUpdateStmt *)0x0;
  zWhere._4_4_ = 0;
  *ppStmt = (sqlite3_stmt *)0x0;
  pUp = (RbuUpdateStmt *)&pIter->pRbuUpdate;
  while( true ) {
    if (pUp->zMask == (char *)0x0) {
      if (zWhere._4_4_ < 0x10) {
        pRStack_40 = (RbuUpdateStmt *)rbuMalloc(p,(long)pIter->nTblCol + 0x19);
      }
      else {
        for (pUp = (RbuUpdateStmt *)&pIter->pRbuUpdate; (RbuUpdateStmt *)pUp->zMask != pRStack_40;
            pUp = (RbuUpdateStmt *)(pUp->zMask + 0x10)) {
        }
        pUp->zMask = (char *)0x0;
        sqlite3_finalize(pRStack_40->pUpdate);
        pRStack_40->pUpdate = (sqlite3_stmt *)0x0;
      }
      if (pRStack_40 != (RbuUpdateStmt *)0x0) {
        p_00 = rbuObjIterGetWhere(p,pIter);
        p_01 = rbuObjIterGetSetlist(p,pIter,zMask);
        pRStack_40->zMask = (char *)(pRStack_40 + 1);
        memcpy(pRStack_40->zMask,zMask,(long)pIter->nTblCol);
        pRStack_40->pNext = pIter->pRbuUpdate;
        pIter->pRbuUpdate = pRStack_40;
        if (p_01 != (char *)0x0) {
          pcVar2 = "";
          if (pIter->eType != 5) {
            pcVar2 = "rbu_imp_";
          }
          pcVar2 = sqlite3_mprintf("UPDATE \"%s%w\" SET %s WHERE %s",pcVar2,pIter->zTbl,p_01,p_00,
                                   in_R9,pcVar2,0);
          iVar1 = prepareFreeAndCollectError(p->dbMain,&pRStack_40->pUpdate,&p->zErrmsg,pcVar2);
          p->rc = iVar1;
          *ppStmt = pRStack_40->pUpdate;
        }
        sqlite3_free(p_00);
        sqlite3_free(p_01);
      }
      return p->rc;
    }
    pRStack_40 = (RbuUpdateStmt *)pUp->zMask;
    iVar1 = strcmp(pRStack_40->zMask,zMask);
    if (iVar1 == 0) break;
    zWhere._4_4_ = zWhere._4_4_ + 1;
    pUp = (RbuUpdateStmt *)(pUp->zMask + 0x10);
  }
  pUp->zMask = (char *)pRStack_40->pNext;
  pRStack_40->pNext = pIter->pRbuUpdate;
  pIter->pRbuUpdate = pRStack_40;
  *ppStmt = pRStack_40->pUpdate;
  return 0;
}

Assistant:

static int rbuGetUpdateStmt(
  sqlite3rbu *p,                  /* RBU handle */
  RbuObjIter *pIter,              /* Object iterator */
  const char *zMask,              /* rbu_control value ('x.x.') */
  sqlite3_stmt **ppStmt           /* OUT: UPDATE statement handle */
){
  RbuUpdateStmt **pp;
  RbuUpdateStmt *pUp = 0;
  int nUp = 0;

  /* In case an error occurs */
  *ppStmt = 0;

  /* Search for an existing statement. If one is found, shift it to the front
  ** of the LRU queue and return immediately. Otherwise, leave nUp pointing
  ** to the number of statements currently in the cache and pUp to the
  ** last object in the list.  */
  for(pp=&pIter->pRbuUpdate; *pp; pp=&((*pp)->pNext)){
    pUp = *pp;
    if( strcmp(pUp->zMask, zMask)==0 ){
      *pp = pUp->pNext;
      pUp->pNext = pIter->pRbuUpdate;
      pIter->pRbuUpdate = pUp;
      *ppStmt = pUp->pUpdate; 
      return SQLITE_OK;
    }
    nUp++;
  }
  assert( pUp==0 || pUp->pNext==0 );

  if( nUp>=SQLITE_RBU_UPDATE_CACHESIZE ){
    for(pp=&pIter->pRbuUpdate; *pp!=pUp; pp=&((*pp)->pNext));
    *pp = 0;
    sqlite3_finalize(pUp->pUpdate);
    pUp->pUpdate = 0;
  }else{
    pUp = (RbuUpdateStmt*)rbuMalloc(p, sizeof(RbuUpdateStmt)+pIter->nTblCol+1);
  }

  if( pUp ){
    char *zWhere = rbuObjIterGetWhere(p, pIter);
    char *zSet = rbuObjIterGetSetlist(p, pIter, zMask);
    char *zUpdate = 0;

    pUp->zMask = (char*)&pUp[1];
    memcpy(pUp->zMask, zMask, pIter->nTblCol);
    pUp->pNext = pIter->pRbuUpdate;
    pIter->pRbuUpdate = pUp;

    if( zSet ){
      const char *zPrefix = "";

      if( pIter->eType!=RBU_PK_VTAB ) zPrefix = "rbu_imp_";
      zUpdate = sqlite3_mprintf("UPDATE \"%s%w\" SET %s WHERE %s", 
          zPrefix, pIter->zTbl, zSet, zWhere
      );
      p->rc = prepareFreeAndCollectError(
          p->dbMain, &pUp->pUpdate, &p->zErrmsg, zUpdate
      );
      *ppStmt = pUp->pUpdate;
    }
    sqlite3_free(zWhere);
    sqlite3_free(zSet);
  }

  return p->rc;
}